

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_autoindex_module.c
# Opt level: O0

char * ngx_http_autoindex_merge_loc_conf(ngx_conf_t *cf,void *parent,void *child)

{
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  ngx_http_autoindex_loc_conf_t *conf;
  ngx_http_autoindex_loc_conf_t *prev;
  void *child_local;
  void *parent_local;
  ngx_conf_t *cf_local;
  
  if (*child == -1) {
    if (*parent == -1) {
      local_38 = 0;
    }
    else {
      local_38 = *parent;
    }
    *(undefined8 *)child = local_38;
  }
  if (*(long *)((long)child + 8) == -1) {
    if (*(long *)((long)parent + 8) == -1) {
      local_40 = 0;
    }
    else {
      local_40 = *(undefined8 *)((long)parent + 8);
    }
    *(undefined8 *)((long)child + 8) = local_40;
  }
  if (*(long *)((long)child + 0x10) == -1) {
    if (*(long *)((long)parent + 0x10) == -1) {
      local_48 = 0;
    }
    else {
      local_48 = *(undefined8 *)((long)parent + 0x10);
    }
    *(undefined8 *)((long)child + 0x10) = local_48;
  }
  if (*(long *)((long)child + 0x18) == -1) {
    if (*(long *)((long)parent + 0x18) == -1) {
      local_50 = 1;
    }
    else {
      local_50 = *(undefined8 *)((long)parent + 0x18);
    }
    *(undefined8 *)((long)child + 0x18) = local_50;
  }
  return (char *)0x0;
}

Assistant:

static char *
ngx_http_autoindex_merge_loc_conf(ngx_conf_t *cf, void *parent, void *child)
{
    ngx_http_autoindex_loc_conf_t *prev = parent;
    ngx_http_autoindex_loc_conf_t *conf = child;

    ngx_conf_merge_value(conf->enable, prev->enable, 0);
    ngx_conf_merge_uint_value(conf->format, prev->format,
                              NGX_HTTP_AUTOINDEX_HTML);
    ngx_conf_merge_value(conf->localtime, prev->localtime, 0);
    ngx_conf_merge_value(conf->exact_size, prev->exact_size, 1);

    return NGX_CONF_OK;
}